

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall testing::internal::String::ShowWideCString(String *this,wchar_t *wide_c_str)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar2;
  String SVar3;
  char *local_20 [2];
  
  if (wide_c_str == (wchar_t *)0x0) {
    pcVar1 = (char *)operator_new__(7);
    builtin_strncpy(pcVar1,"(null)",7);
    this->c_str_ = pcVar1;
    this->length_ = 6;
    sVar2 = extraout_RDX_01;
  }
  else {
    WideStringToUtf8((internal *)local_20,wide_c_str,-1);
    String(this,local_20[0]);
    sVar2 = extraout_RDX;
    if (local_20[0] != (char *)0x0) {
      operator_delete__(local_20[0]);
      sVar2 = extraout_RDX_00;
    }
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String String::ShowWideCString(const wchar_t * wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String(internal::WideStringToUtf8(wide_c_str, -1).c_str());
}